

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls13_enc.cc
# Opt level: O0

bool bssl::tls13_init_early_key_schedule(SSL_HANDSHAKE *hs,SSL_SESSION *session)

{
  SSL_HANDSHAKE *hs_00;
  SSL_SESSION *pSVar1;
  bool bVar2;
  uint16_t version;
  size_t in_R8;
  Span<const_unsigned_char> in;
  bool local_39;
  SSL_HANDSHAKE *local_38;
  SSLTranscript *local_30;
  uchar *local_28;
  SSL_HANDSHAKE *local_20;
  SSLTranscript *transcript;
  SSL_SESSION *session_local;
  SSL_HANDSHAKE *hs_local;
  
  transcript = (SSLTranscript *)session;
  session_local = (SSL_SESSION *)hs;
  if (((hs->ssl->field_0xa4 & 1 ^ 0xff) & 1) != 0) {
    bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&hs->selected_ech_config);
    pSVar1 = session_local;
    if (bVar2) {
      local_38 = (SSL_HANDSHAKE *)(session_local[1].session_id.storage_ + 0x1d);
    }
    else {
      local_38 = (SSL_HANDSHAKE *)(session_local[1].secret.storage_ + 0x2e);
    }
    local_20 = local_38;
    version = ssl_session_protocol_version((SSL_SESSION *)transcript);
    bVar2 = init_key_schedule((SSL_HANDSHAKE *)pSVar1,(SSLTranscript *)local_38,version,
                              (SSL_CIPHER *)transcript[4].hash_.ctx_.pctx);
    pSVar1 = session_local;
    hs_00 = local_20;
    local_39 = false;
    if (bVar2) {
      Span<unsigned_char_const>::
      Span<bssl::InplaceVector<unsigned_char,64ul>,void,bssl::InplaceVector<unsigned_char,64ul>>
                ((Span<unsigned_char_const> *)&local_30,
                 (InplaceVector<unsigned_char,_64UL> *)((long)&(transcript->hash_).ctx_.digest + 2))
      ;
      in.size_ = in_R8;
      in.data_ = local_28;
      local_39 = hkdf_extract_to_secret((bssl *)pSVar1,hs_00,local_30,in);
    }
    return local_39;
  }
  __assert_fail("!hs->ssl->server",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_enc.cc"
                ,0x50,
                "bool bssl::tls13_init_early_key_schedule(SSL_HANDSHAKE *, const SSL_SESSION *)");
}

Assistant:

bool tls13_init_early_key_schedule(SSL_HANDSHAKE *hs,
                                   const SSL_SESSION *session) {
  assert(!hs->ssl->server);
  // When offering ECH, early data is associated with ClientHelloInner, not
  // ClientHelloOuter.
  SSLTranscript *transcript =
      hs->selected_ech_config ? &hs->inner_transcript : &hs->transcript;
  return init_key_schedule(hs, transcript,
                           ssl_session_protocol_version(session),
                           session->cipher) &&
         hkdf_extract_to_secret(hs, *transcript, session->secret);
}